

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturemanager.cpp
# Opt level: O0

int __thiscall FTextureManager::CountTexturesX(FTextureManager *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int texlump2;
  int texlump1;
  int pnames;
  int wadnum;
  int wadcount;
  int count;
  FTextureManager *this_local;
  
  wadnum = 0;
  iVar1 = FWadCollection::GetNumWads(&Wads);
  for (texlump1 = 0; texlump1 < iVar1; texlump1 = texlump1 + 1) {
    iVar2 = FWadCollection::CheckNumForName(&Wads,"PNAMES",0,texlump1,false);
    if (-1 < iVar2) {
      iVar3 = FWadCollection::GetLumpFile(&Wads,iVar2);
      if (iVar3 == texlump1) {
        iVar2 = CountLumpTextures(this,iVar2);
        wadnum = iVar2 + wadnum;
      }
      iVar2 = FWadCollection::CheckNumForName(&Wads,"TEXTURE1",0,texlump1,true);
      iVar3 = FWadCollection::CheckNumForName(&Wads,"TEXTURE2",0,texlump1,true);
      iVar2 = CountLumpTextures(this,iVar2);
      iVar3 = CountLumpTextures(this,iVar3);
      wadnum = iVar3 + iVar2 + -2 + wadnum;
    }
  }
  return wadnum;
}

Assistant:

int FTextureManager::CountTexturesX ()
{
	int count = 0;
	int wadcount = Wads.GetNumWads();
	for (int wadnum = 0; wadnum < wadcount; wadnum++)
	{
		// Use the most recent PNAMES for this WAD.
		// Multiple PNAMES in a WAD will be ignored.
		int pnames = Wads.CheckNumForName("PNAMES", ns_global, wadnum, false);

		// should never happen except for zdoom.pk3
		if (pnames < 0) continue;

		// Only count the patches if the PNAMES come from the current file
		// Otherwise they have already been counted.
		if (Wads.GetLumpFile(pnames) == wadnum) 
		{
			count += CountLumpTextures (pnames);
		}

		int texlump1 = Wads.CheckNumForName ("TEXTURE1", ns_global, wadnum);
		int texlump2 = Wads.CheckNumForName ("TEXTURE2", ns_global, wadnum);

		count += CountLumpTextures (texlump1) - 1;
		count += CountLumpTextures (texlump2) - 1;
	}
	return count;
}